

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O0

HAnimHierarchy *
rw::HAnimHierarchy::create
          (int32 numNodes,int32 *nodeFlags,int32 *nodeIDs,int32 flags,int32 maxKeySize)

{
  FILE *__stream;
  char *pcVar1;
  AnimInterpolator *pAVar2;
  void *pvVar3;
  int local_44;
  uint32 local_40;
  int32 i;
  Error _e;
  HAnimHierarchy *hier;
  int32 maxKeySize_local;
  int32 flags_local;
  int32 *nodeIDs_local;
  int32 *nodeFlags_local;
  uint32 uStack_10;
  int32 numNodes_local;
  
  _e = (Error)malloc_LOC(0x38,0x3011e,
                         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/hanim.cpp line: 33"
                        );
  if (_e == (Error)0x0) {
    local_40 = 0x11e;
    i = -0x7ffffffe;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/hanim.cpp",0x23);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000002,0x38);
    fprintf(__stream,"%s\n",pcVar1);
    setError((Error *)&stack0xffffffffffffffc0);
    uStack_10 = 0;
    numNodes_local = 0;
  }
  else {
    pAVar2 = AnimInterpolator::create(numNodes,maxKeySize);
    *(AnimInterpolator **)((long)_e + 0x30) = pAVar2;
    *(int32 *)((long)_e + 4) = numNodes;
    *(int32 *)_e = flags;
    *(undefined8 *)((long)_e + 0x20) = 0;
    *(Error *)((long)_e + 0x28) = _e;
    if ((*(uint *)_e & 2) == 0) {
      pvVar3 = mustmalloc_LOC((long)(*(int *)((long)_e + 4) * 0x40 + 0xf),0x3011e,
                              "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/hanim.cpp line: 48"
                             );
      *(void **)((long)_e + 0x10) = pvVar3;
      *(ulong *)((long)_e + 8) = *(long *)((long)_e + 0x10) + 0xfU & 0xfffffffffffffff0;
    }
    else {
      *(undefined8 *)((long)_e + 8) = 0;
      *(undefined8 *)((long)_e + 0x10) = 0;
    }
    pvVar3 = mustmalloc_LOC((long)*(int *)((long)_e + 4) * 0x18,0x3011e,
                            "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/hanim.cpp line: 52"
                           );
    *(void **)((long)_e + 0x18) = pvVar3;
    for (local_44 = 0; local_44 < *(int *)((long)_e + 4); local_44 = local_44 + 1) {
      if (nodeIDs == (int32 *)0x0) {
        *(undefined4 *)(*(long *)((long)_e + 0x18) + (long)local_44 * 0x18) = 0;
      }
      else {
        *(int32 *)(*(long *)((long)_e + 0x18) + (long)local_44 * 0x18) = nodeIDs[local_44];
      }
      *(int *)(*(long *)((long)_e + 0x18) + (long)local_44 * 0x18 + 4) = local_44;
      if (nodeFlags == (int32 *)0x0) {
        *(undefined4 *)(*(long *)((long)_e + 0x18) + (long)local_44 * 0x18 + 8) = 0;
      }
      else {
        *(int32 *)(*(long *)((long)_e + 0x18) + (long)local_44 * 0x18 + 8) = nodeFlags[local_44];
      }
      *(undefined8 *)(*(long *)((long)_e + 0x18) + (long)local_44 * 0x18 + 0x10) = 0;
    }
    _uStack_10 = _e;
  }
  return (HAnimHierarchy *)_uStack_10;
}

Assistant:

HAnimHierarchy*
HAnimHierarchy::create(int32 numNodes, int32 *nodeFlags, int32 *nodeIDs,
                       int32 flags, int32 maxKeySize)
{
	HAnimHierarchy *hier = (HAnimHierarchy*)rwMalloc(sizeof(*hier), MEMDUR_EVENT | ID_HANIM);
	if(hier == nil){
		RWERROR((ERR_ALLOC, sizeof(*hier)));
		return nil;
	}
	hier->interpolator = AnimInterpolator::create(numNodes, maxKeySize);

	hier->numNodes = numNodes;
	hier->flags = flags;
	hier->parentFrame = nil;
	hier->parentHierarchy = hier;
	if(hier->flags & NOMATRICES){
		hier->matrices = nil;
		hier->matricesUnaligned = nil;
	}else{
		hier->matricesUnaligned = rwNew(hier->numNodes*64 + 0xF, MEMDUR_EVENT | ID_HANIM);
		hier->matrices =
		  (Matrix*)(((uintptr)hier->matricesUnaligned + 0xF) & ~0xF);
	}
	hier->nodeInfo = rwNewT(HAnimNodeInfo, hier->numNodes, MEMDUR_EVENT | ID_HANIM);
	for(int32 i = 0; i < hier->numNodes; i++){
		if(nodeIDs)
			hier->nodeInfo[i].id = nodeIDs[i];
		else
			hier->nodeInfo[i].id = 0;
		hier->nodeInfo[i].index = i;
		if(nodeFlags)
			hier->nodeInfo[i].flags = nodeFlags[i];
		else
			hier->nodeInfo[i].flags = 0;
		hier->nodeInfo[i].frame = nil;
	}
	return hier;
}